

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test10::prepareFunctions(GPUShaderFP64Test10 *this)

{
  vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
  *this_00;
  iterator iVar1;
  uint in_EAX;
  undefined8 uStack_18;
  
  this_00 = &this->m_functions;
  uStack_18 = (ulong)in_EAX;
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_ABS;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_CEIL;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_CLAMP;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(3,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_CLAMP_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_CROSS;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_DETERMINANT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(6,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_DISTANCE;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(7,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_DOT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(8,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_EQUAL;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(9,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_FACEFORWARD;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(10,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_FLOOR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0xb,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_FMA;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0xc,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_FRACT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0xd,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_FREXP;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0xe,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_GREATERTHAN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0xf,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_GREATERTHANEQUAL;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x10,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_INVERSE;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x11,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_INVERSESQRT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x12,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_LDEXP;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x13,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_LESSTHAN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x14,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_LESSTHANEQUAL;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x15,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_LENGTH;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x16,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MATRIXCOMPMULT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x17,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MAX;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x18,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MAX_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x19,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MIN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1a,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MIN_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1b,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MIX;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1c,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MOD;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1d,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MOD_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1e,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_MODF;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x1f,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_NORMALIZE;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x20,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_NOTEQUAL;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x21,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_OUTERPRODUCT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x22,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_PACKDOUBLE2X32;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x23,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_REFLECT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x24,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_REFRACT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x25,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_ROUND;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x26,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_ROUNDEVEN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x27,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_SIGN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x28,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_SMOOTHSTEP;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x29,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_SMOOTHSTEP_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2a,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_SQRT;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2b,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_STEP;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2c,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_STEP_AGAINST_SCALAR;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2d,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_TRANSPOSE;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2e,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_TRUNC;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x2f,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_UNPACKDOUBLE2X32;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x30,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_ISNAN;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uStack_18 = CONCAT44(0x31,(undefined4)uStack_18);
  iVar1._M_current =
       (this->m_functions).
       super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->m_functions).
      super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ::_M_realloc_insert<gl4cts::GPUShaderFP64Test10::functionEnum>
              (this_00,iVar1,(functionEnum *)((long)&uStack_18 + 4));
  }
  else {
    *iVar1._M_current = FUNCTION_ISINF;
    (this->m_functions).
    super__Vector_base<gl4cts::GPUShaderFP64Test10::functionEnum,_std::allocator<gl4cts::GPUShaderFP64Test10::functionEnum>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareFunctions()
{
	m_functions.push_back(FUNCTION_ABS);
	m_functions.push_back(FUNCTION_CEIL);
	m_functions.push_back(FUNCTION_CLAMP);
	m_functions.push_back(FUNCTION_CLAMP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_CROSS);
	m_functions.push_back(FUNCTION_DETERMINANT);
	m_functions.push_back(FUNCTION_DISTANCE);
	m_functions.push_back(FUNCTION_DOT);
	m_functions.push_back(FUNCTION_EQUAL);
	m_functions.push_back(FUNCTION_FACEFORWARD);
	m_functions.push_back(FUNCTION_FLOOR);
	m_functions.push_back(FUNCTION_FMA);
	m_functions.push_back(FUNCTION_FRACT);
	m_functions.push_back(FUNCTION_FREXP);
	m_functions.push_back(FUNCTION_GREATERTHAN);
	m_functions.push_back(FUNCTION_GREATERTHANEQUAL);
	m_functions.push_back(FUNCTION_INVERSE);
	m_functions.push_back(FUNCTION_INVERSESQRT);
	m_functions.push_back(FUNCTION_LDEXP);
	m_functions.push_back(FUNCTION_LESSTHAN);
	m_functions.push_back(FUNCTION_LESSTHANEQUAL);
	m_functions.push_back(FUNCTION_LENGTH);
	m_functions.push_back(FUNCTION_MATRIXCOMPMULT);
	m_functions.push_back(FUNCTION_MAX);
	m_functions.push_back(FUNCTION_MAX_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIN);
	m_functions.push_back(FUNCTION_MIN_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MIX);
	m_functions.push_back(FUNCTION_MOD);
	m_functions.push_back(FUNCTION_MOD_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_MODF);
	m_functions.push_back(FUNCTION_NORMALIZE);
	m_functions.push_back(FUNCTION_NOTEQUAL);
	m_functions.push_back(FUNCTION_OUTERPRODUCT);
	m_functions.push_back(FUNCTION_PACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_REFLECT);
	m_functions.push_back(FUNCTION_REFRACT);
	m_functions.push_back(FUNCTION_ROUND);
	m_functions.push_back(FUNCTION_ROUNDEVEN);
	m_functions.push_back(FUNCTION_SIGN);
	m_functions.push_back(FUNCTION_SMOOTHSTEP);
	m_functions.push_back(FUNCTION_SMOOTHSTEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_SQRT);
	m_functions.push_back(FUNCTION_STEP);
	m_functions.push_back(FUNCTION_STEP_AGAINST_SCALAR);
	m_functions.push_back(FUNCTION_TRANSPOSE);
	m_functions.push_back(FUNCTION_TRUNC);
	m_functions.push_back(FUNCTION_UNPACKDOUBLE2X32);
	m_functions.push_back(FUNCTION_ISNAN);
	m_functions.push_back(FUNCTION_ISINF);
}